

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_algebraic.h
# Opt level: O1

void __thiscall
mp::AlgebraicExpression<mp::LinTerms>::AlgebraicExpression
          (AlgebraicExpression<mp::LinTerms> *this,Variable i)

{
  int local_1c;
  double local_18;
  
  (this->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (this->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(this->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.
             m_data.m_storage;
  (this->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (this->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (this->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(this->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             m_storage;
  (this->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  this->constant_term_ = 0.0;
  local_18 = 1.0;
  local_1c = i.v;
  gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
            ((small_vector_base<std::allocator<double>,6u> *)this,&local_18);
  gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
            ((small_vector_base<std::allocator<int>,6u> *)&(this->super_LinTerms).vars_,&local_1c);
  return;
}

Assistant:

AlgebraicExpression(Variable i) { Body::add_term(1.0, i.v); }